

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringTest.cpp
# Opt level: O0

void __thiscall StringTest::Test10(StringTest *this)

{
  int iVar1;
  allocator<char> local_69;
  uint i;
  string t2;
  allocator<char> local_31;
  string local_30 [8];
  string t1;
  StringTest *this_local;
  
  t1.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_30,"This is y a sentence with vowels.",&local_31);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&i,"aeiou",&local_69);
  std::allocator<char>::~allocator(&local_69);
  iVar1 = std::__cxx11::string::find_first_of(local_30,(ulong)&i);
  if (iVar1 != 2) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x276,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of(local_30,(ulong)&i);
  if (iVar1 != 2) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x27b,"Failed to find first vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of(local_30,(ulong)&i);
  if (iVar1 != 5) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x280,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of((char *)local_30,0x10ba12);
  if (iVar1 != 5) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x285,"Failed to find second vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of((char *)local_30,0x10ba4f,6);
  if (iVar1 != 10) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x28a,"Failed to find third vowel");
  }
  iVar1 = std::__cxx11::string::find_first_of((char)local_30,0x79);
  if (iVar1 != 8) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x28f,"Failed to find \'y\'");
  }
  iVar1 = std::__cxx11::string::find_first_of((char)local_30,0x73);
  if (iVar1 != 0xc) {
    TestCase::TestFailedInternal
              (&this->super_TestCase,
               "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/stringTest.cpp"
               ,0x294,"Failed to find \'s\'");
  }
  TestCase::TestPassed(&this->super_TestCase);
  std::__cxx11::string::~string((string *)&i);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void Test10()
	{
		// find_first_of
		string t1 = "This is y a sentence with vowels.";
		string t2 = "aeiou";
		
		unsigned i = t1.find_first_of( t2 );
		
		if ( i != 2 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_first_of( t2, 2 );

		if ( i != 2 )
			TestFailed( "Failed to find first vowel" );

		i = t1.find_first_of( t2, 3 );

		if ( i != 5 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_first_of( "aeiou", 3 );

		if ( i != 5 )
			TestFailed( "Failed to find second vowel" );

		i = t1.find_first_of( "aeiouy", 6, 5 );

		if ( i != 10 )
			TestFailed( "Failed to find third vowel" );

		i = t1.find_first_of( 'y' );

		if ( i != 8 )
			TestFailed( "Failed to find \'y\'" );

		i = t1.find_first_of( 's', 8 );

		if ( i != 12 )
			TestFailed( "Failed to find \'s\'" );
		
		TestPassed();
	}